

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::variable_decl(CompilerGLSL *this,SPIRType *type,string *name,uint32_t id)

{
  undefined4 in_register_0000000c;
  uint in_R8D;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80 [48];
  string local_50 [8];
  string type_name;
  uint32_t id_local;
  string *name_local;
  SPIRType *type_local;
  CompilerGLSL *this_local;
  
  (*(type->super_IVariant)._vptr_IVariant[0x13])(local_50,type,name,(ulong)in_R8D);
  Compiler::remap_variable_type_name
            ((Compiler *)type,(SPIRType *)name,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_register_0000000c,id),local_50);
  (*(type->super_IVariant)._vptr_IVariant[0x25])(local_80,type,name);
  join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,std::__cxx11::string>
            ((spirv_cross *)this,local_50,(char (*) [2])0x5b521c,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_register_0000000c,id),local_80);
  ::std::__cxx11::string::~string((string *)local_80);
  ::std::__cxx11::string::~string((string *)local_50);
  return this;
}

Assistant:

string CompilerGLSL::variable_decl(const SPIRType &type, const string &name, uint32_t id)
{
	string type_name = type_to_glsl(type, id);
	remap_variable_type_name(type, name, type_name);
	return join(type_name, " ", name, type_to_array_glsl(type));
}